

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.c
# Opt level: O0

int region_get_data(region *reg,char *buf,int len)

{
  line *local_30;
  line *lp;
  int local_20;
  int off;
  int i;
  int len_local;
  char *buf_local;
  region *reg_local;
  
  lp._4_4_ = reg->r_offset;
  local_30 = reg->r_linep;
  for (local_20 = 0; local_20 < len; local_20 = local_20 + 1) {
    if (lp._4_4_ == local_30->l_used) {
      local_30 = local_30->l_fp;
      if (local_30 == curbp->b_headp) break;
      lp._4_4_ = 0;
      buf[local_20] = *curbp->b_nlchr;
    }
    else {
      buf[local_20] = local_30->l_text[lp._4_4_];
      lp._4_4_ = lp._4_4_ + 1;
    }
  }
  buf[local_20] = '\0';
  return local_20;
}

Assistant:

int
region_get_data(struct region *reg, char *buf, int len)
{
	int	 i, off;
	struct line	*lp;

	off = reg->r_offset;
	lp = reg->r_linep;
	for (i = 0; i < len; i++) {
		if (off == llength(lp)) {
			lp = lforw(lp);
			if (lp == curbp->b_headp)
				break;
			off = 0;
			buf[i] = *curbp->b_nlchr;
		} else {
			buf[i] = lgetc(lp, off);
			off++;
		}
	}
	buf[i] = '\0';
	return (i);
}